

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O3

int default_stream_scheduler_update_state(quicly_stream_scheduler_t *self,quicly_stream_t *stream)

{
  quicly_linklist_t *pqVar1;
  quicly_conn_t *pqVar2;
  st_quicly_linklist_t *psVar3;
  st_quicly_linklist_t *psVar4;
  int iVar5;
  
  pqVar2 = stream->conn;
  iVar5 = quicly_stream_can_send(stream,1);
  if (iVar5 == 0) {
    pqVar1 = &(stream->_send_aux).pending_link.default_scheduler;
    psVar3 = (stream->_send_aux).pending_link.default_scheduler.prev;
    if (psVar3 != pqVar1) {
      psVar4 = (stream->_send_aux).pending_link.default_scheduler.next;
      psVar3->next = psVar4;
      psVar4->prev = psVar3;
      (stream->_send_aux).pending_link.default_scheduler.next = pqVar1;
      (stream->_send_aux).pending_link.default_scheduler.prev = pqVar1;
    }
  }
  else {
    iVar5 = quicly_is_blocked(stream->conn);
    link_stream(&(pqVar2->super)._default_scheduler,stream,iVar5);
  }
  return 0;
}

Assistant:

static int default_stream_scheduler_update_state(quicly_stream_scheduler_t *self, quicly_stream_t *stream)
{
    struct st_quicly_default_scheduler_state_t *sched = &((struct _st_quicly_conn_public_t *)stream->conn)->_default_scheduler;

    if (quicly_stream_can_send(stream, 1)) {
        /* activate if not */
        link_stream(sched, stream, quicly_is_blocked(stream->conn));
    } else {
        /* disactivate if active */
        if (quicly_linklist_is_linked(&stream->_send_aux.pending_link.default_scheduler))
            quicly_linklist_unlink(&stream->_send_aux.pending_link.default_scheduler);
    }

    return 0;
}